

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O2

bool __thiscall MidiInApi::MidiQueue::push(MidiQueue *this,MidiMessage *msg)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = this->back;
  uVar2 = 0;
  if (uVar1 < this->front) {
    uVar2 = this->ringSize;
  }
  uVar2 = (uVar1 - this->front) + uVar2;
  uVar3 = this->ringSize - 1;
  if (uVar2 < uVar3) {
    MidiMessage::operator=(this->ring + uVar1,msg);
    this->back = (this->back + 1) % this->ringSize;
  }
  return uVar2 < uVar3;
}

Assistant:

bool MidiInApi::MidiQueue::push( const MidiInApi::MidiMessage& msg )
{
  // Local stack copies of front/back
  unsigned int _back, _front, _size;

  // Get back/front indexes exactly once and calculate current size
  _size = size( &_back, &_front );

  if ( _size < ringSize-1 )
  {
    ring[_back] = msg;
    back = (back+1)%ringSize;
    return true;
  }

  return false;
}